

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frontend_tester.cpp
# Opt level: O0

FailStep run(string *str)

{
  bool bVar1;
  element_type *this;
  ostream *poVar2;
  element_type *this_00;
  shared_ptr<ScriptAstNode> *script_00;
  undefined1 local_98 [8];
  shared_ptr<SemanticAnalyzer> analyzer;
  undefined1 local_80 [8];
  optional<std::shared_ptr<ScriptAstNode>_> script;
  shared_ptr<Parser> parser;
  shared_ptr<TokenBuffer> tokenBuffer;
  undefined1 local_38 [8];
  shared_ptr<Tokenizer> tokenizer;
  shared_ptr<StringReader> reader;
  string *str_local;
  
  std::make_shared<StringReader,std::__cxx11::string_const&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &tokenizer.super___shared_ptr<Tokenizer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::make_shared<Tokenizer,std::shared_ptr<StringReader>&>((shared_ptr<StringReader> *)local_38);
  std::make_shared<TokenBuffer,std::shared_ptr<Tokenizer>&>
            ((shared_ptr<Tokenizer> *)
             &parser.super___shared_ptr<Parser,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::make_shared<Parser,std::shared_ptr<TokenBuffer>&,std::ostream&>
            ((shared_ptr<TokenBuffer> *)
             &script.super__Optional_base<std::shared_ptr<ScriptAstNode>,_false,_false>._M_payload.
              super__Optional_payload<std::shared_ptr<ScriptAstNode>,_true,_false,_false>.
              super__Optional_payload_base<std::shared_ptr<ScriptAstNode>_>._M_engaged,
             (basic_ostream<char,_std::char_traits<char>_> *)
             &parser.super___shared_ptr<Parser,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  this = std::__shared_ptr_access<Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                   ((__shared_ptr_access<Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                    &script.super__Optional_base<std::shared_ptr<ScriptAstNode>,_false,_false>.
                     _M_payload.
                     super__Optional_payload<std::shared_ptr<ScriptAstNode>,_true,_false,_false>.
                     super__Optional_payload_base<std::shared_ptr<ScriptAstNode>_>._M_engaged);
  Parser::parseScript((optional<std::shared_ptr<ScriptAstNode>_> *)local_80,this);
  bVar1 = std::optional::operator_cast_to_bool((optional *)local_80);
  if (bVar1) {
    std::make_shared<SemanticAnalyzer,std::ostream&,std::shared_ptr<StringReader>&>
              ((basic_ostream<char,_std::char_traits<char>_> *)local_98,
               (shared_ptr<StringReader> *)&std::cout);
    this_00 = std::__shared_ptr_access<SemanticAnalyzer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<SemanticAnalyzer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_98);
    script_00 = std::optional<std::shared_ptr<ScriptAstNode>_>::value
                          ((optional<std::shared_ptr<ScriptAstNode>_> *)local_80);
    bVar1 = SemanticAnalyzer::isValid(this_00,script_00);
    if (bVar1) {
      poVar2 = std::operator<<((ostream *)&std::cout,"No Failure!");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      str_local._4_4_ = None;
    }
    else {
      poVar2 = std::operator<<((ostream *)&std::cerr,"Failure during semantic analysis!");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      str_local._4_4_ = SemanticAnalysis;
    }
    analyzer.super___shared_ptr<SemanticAnalyzer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
    _4_4_ = 1;
    std::shared_ptr<SemanticAnalyzer>::~shared_ptr((shared_ptr<SemanticAnalyzer> *)local_98);
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Failure during parsing!");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    str_local._4_4_ = Parsing;
    analyzer.super___shared_ptr<SemanticAnalyzer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
    _4_4_ = 1;
  }
  std::optional<std::shared_ptr<ScriptAstNode>_>::~optional
            ((optional<std::shared_ptr<ScriptAstNode>_> *)local_80);
  std::shared_ptr<Parser>::~shared_ptr
            ((shared_ptr<Parser> *)
             &script.super__Optional_base<std::shared_ptr<ScriptAstNode>,_false,_false>._M_payload.
              super__Optional_payload<std::shared_ptr<ScriptAstNode>,_true,_false,_false>.
              super__Optional_payload_base<std::shared_ptr<ScriptAstNode>_>._M_engaged);
  std::shared_ptr<TokenBuffer>::~shared_ptr
            ((shared_ptr<TokenBuffer> *)
             &parser.super___shared_ptr<Parser,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<Tokenizer>::~shared_ptr((shared_ptr<Tokenizer> *)local_38);
  std::shared_ptr<StringReader>::~shared_ptr
            ((shared_ptr<StringReader> *)
             &tokenizer.super___shared_ptr<Tokenizer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return str_local._4_4_;
}

Assistant:

FailStep run(const std::string & str) {

  auto reader = std::make_shared<StringReader>(str);
  auto tokenizer = std::make_shared<Tokenizer>(reader);
  auto tokenBuffer = std::make_shared<TokenBuffer>(tokenizer);
  auto parser = std::make_shared<Parser>(tokenBuffer, std::cout);

  auto script = parser->parseScript();

  if (!script) {
    std::cerr << "Failure during parsing!" << std::endl;
    return FailStep::Parsing;
  }

  auto analyzer = std::make_shared<SemanticAnalyzer>(std::cout, reader);

  if (!analyzer->isValid(script.value())) {
    std::cerr << "Failure during semantic analysis!" << std::endl;
    return FailStep::SemanticAnalysis;
  }

  std::cout << "No Failure!" << std::endl;

  return FailStep::None;
}